

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PpContext.h
# Opt level: O1

int __thiscall glslang::TPpContext::scanToken(TPpContext *this,TPpToken *ppToken)

{
  pointer *ppTVar1;
  tInput *ptVar2;
  pointer pptVar3;
  pointer pTVar4;
  iterator __position;
  iterator __position_00;
  undefined4 uVar5;
  bool bVar6;
  int iVar7;
  pointer pptVar8;
  pointer piVar9;
  pointer piVar10;
  int iVar11;
  bool bVar12;
  bool bVar13;
  int token;
  int local_34;
  
  local_34 = -1;
  pptVar8 = (this->inputStack).
            super__Vector_base<glslang::TPpContext::tInput_*,_std::allocator<glslang::TPpContext::tInput_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->inputStack).
      super__Vector_base<glslang::TPpContext::tInput_*,_std::allocator<glslang::TPpContext::tInput_*>_>
      ._M_impl.super__Vector_impl_data._M_start != pptVar8) {
    do {
      local_34 = (*pptVar8[-1]->_vptr_tInput[2])(pptVar8[-1],ppToken);
      if ((local_34 != -1) ||
         ((this->inputStack).
          super__Vector_base<glslang::TPpContext::tInput_*,_std::allocator<glslang::TPpContext::tInput_*>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          (this->inputStack).
          super__Vector_base<glslang::TPpContext::tInput_*,_std::allocator<glslang::TPpContext::tInput_*>_>
          ._M_impl.super__Vector_impl_data._M_finish)) break;
      (*(this->inputStack).
        super__Vector_base<glslang::TPpContext::tInput_*,_std::allocator<glslang::TPpContext::tInput_*>_>
        ._M_impl.super__Vector_impl_data._M_finish[-1]->_vptr_tInput[0xb])();
      ptVar2 = (this->inputStack).
               super__Vector_base<glslang::TPpContext::tInput_*,_std::allocator<glslang::TPpContext::tInput_*>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1];
      if (ptVar2 != (tInput *)0x0) {
        (*ptVar2->_vptr_tInput[1])();
      }
      pptVar3 = (this->inputStack).
                super__Vector_base<glslang::TPpContext::tInput_*,_std::allocator<glslang::TPpContext::tInput_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pptVar8 = (this->inputStack).
                super__Vector_base<glslang::TPpContext::tInput_*,_std::allocator<glslang::TPpContext::tInput_*>_>
                ._M_impl.super__Vector_impl_data._M_finish + -1;
      (this->inputStack).
      super__Vector_base<glslang::TPpContext::tInput_*,_std::allocator<glslang::TPpContext::tInput_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = pptVar8;
    } while (pptVar3 != pptVar8);
  }
  pptVar8 = (this->inputStack).
            super__Vector_base<glslang::TPpContext::tInput_*,_std::allocator<glslang::TPpContext::tInput_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if ((((this->inputStack).
        super__Vector_base<glslang::TPpContext::tInput_*,_std::allocator<glslang::TPpContext::tInput_*>_>
        ._M_impl.super__Vector_impl_data._M_start != pptVar8) &&
      (iVar7 = (*pptVar8[-1]->_vptr_tInput[9])(), (char)iVar7 != '\0')) &&
     (this->inElseSkip == false)) {
    if (local_34 == 10) {
      piVar9 = (this->lastLineTokens).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar10 = (this->lastLineTokens).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (1 < (int)((ulong)((long)piVar10 - (long)piVar9) >> 2)) {
        bVar12 = false;
        iVar7 = 0;
        do {
          iVar11 = iVar7 + 1;
          if (piVar9[iVar7] == 0x23) {
            bVar13 = piVar9[iVar11] != 0x23;
            if (!bVar13) {
              iVar11 = iVar7 + 2;
            }
          }
          else {
            bVar13 = false;
          }
          bVar6 = bVar12;
          if ((bVar13) && (bVar6 = true, bVar12)) {
            (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
                      (this->parseContext,
                       (this->lastLineTokenLocs).
                       super__Vector_base<glslang::TSourceLoc,_std::allocator<glslang::TSourceLoc>_>
                       ._M_impl.super__Vector_impl_data._M_start + iVar7,
                       "(#) can be preceded in its line only by spaces or horizontal tabs","#","");
            bVar6 = bVar12;
          }
          bVar12 = bVar6;
          piVar9 = (this->lastLineTokens).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar10 = (this->lastLineTokens).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          iVar7 = iVar11;
        } while (iVar11 < (int)((ulong)((long)piVar10 - (long)piVar9) >> 2) + -1);
      }
      if (piVar10 != piVar9) {
        (this->lastLineTokens).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = piVar9;
      }
      pTVar4 = (this->lastLineTokenLocs).
               super__Vector_base<glslang::TSourceLoc,_std::allocator<glslang::TSourceLoc>_>._M_impl
               .super__Vector_impl_data._M_start;
      if ((this->lastLineTokenLocs).
          super__Vector_base<glslang::TSourceLoc,_std::allocator<glslang::TSourceLoc>_>._M_impl.
          super__Vector_impl_data._M_finish != pTVar4) {
        (this->lastLineTokenLocs).
        super__Vector_base<glslang::TSourceLoc,_std::allocator<glslang::TSourceLoc>_>._M_impl.
        super__Vector_impl_data._M_finish = pTVar4;
      }
    }
    else {
      __position._M_current =
           (this->lastLineTokens).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->lastLineTokens).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&this->lastLineTokens,__position,&local_34);
      }
      else {
        *__position._M_current = local_34;
        (this->lastLineTokens).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      __position_00._M_current =
           (this->lastLineTokenLocs).
           super__Vector_base<glslang::TSourceLoc,_std::allocator<glslang::TSourceLoc>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position_00._M_current ==
          (this->lastLineTokenLocs).
          super__Vector_base<glslang::TSourceLoc,_std::allocator<glslang::TSourceLoc>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<glslang::TSourceLoc,std::allocator<glslang::TSourceLoc>>::
        _M_realloc_insert<glslang::TSourceLoc_const&>
                  ((vector<glslang::TSourceLoc,std::allocator<glslang::TSourceLoc>> *)
                   &this->lastLineTokenLocs,__position_00,&ppToken->loc);
      }
      else {
        uVar5 = *(undefined4 *)&(ppToken->loc).field_0x14;
        (__position_00._M_current)->column = (ppToken->loc).column;
        *(undefined4 *)&(__position_00._M_current)->field_0x14 = uVar5;
        iVar7 = (ppToken->loc).string;
        iVar11 = (ppToken->loc).line;
        (__position_00._M_current)->name = (ppToken->loc).name;
        (__position_00._M_current)->string = iVar7;
        (__position_00._M_current)->line = iVar11;
        ppTVar1 = &(this->lastLineTokenLocs).
                   super__Vector_base<glslang::TSourceLoc,_std::allocator<glslang::TSourceLoc>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppTVar1 = *ppTVar1 + 1;
      }
    }
  }
  return local_34;
}

Assistant:

int scanToken(TPpToken* ppToken)
    {
        int token = EndOfInput;

        while (! inputStack.empty()) {
            token = inputStack.back()->scan(ppToken);
            if (token != EndOfInput || inputStack.empty())
                break;
            popInput();
        }
        if (!inputStack.empty() && inputStack.back()->isStringInput() && !inElseSkip) {
            if (token == '\n') {
                bool seenNumSign = false;
                for (int i = 0; i < (int)lastLineTokens.size() - 1;) {
                    int curPos = i;
                    int curToken = lastLineTokens[i++];
                    if (curToken == '#' && lastLineTokens[i] == '#') {
                        curToken = PpAtomPaste;
                        i++;
                    }
                    if (curToken == '#') {
                        if (seenNumSign) {
                            parseContext.ppError(lastLineTokenLocs[curPos], "(#) can be preceded in its line only by spaces or horizontal tabs", "#", "");
                        } else {
                            seenNumSign = true;
                        }
                    }
                }
                lastLineTokens.clear();
                lastLineTokenLocs.clear();
            } else {
                lastLineTokens.push_back(token);
                lastLineTokenLocs.push_back(ppToken->loc);
            }
        }
        return token;
    }